

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

bool __thiscall tetgenio::load_var(tetgenio *this,char *filebasename)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  FILE *__stream;
  long lVar3;
  ulong uVar4;
  double *pdVar5;
  int iVar6;
  double dVar7;
  int local_c38;
  int local_c34;
  int i;
  int index;
  char *stringptr;
  char inputline [2048];
  char varfilename [1024];
  FILE *infile;
  char *filebasename_local;
  tetgenio *this_local;
  
  strcpy(inputline + 0x7f8,filebasename);
  strcat(inputline + 0x7f8,".var");
  __stream = fopen(inputline + 0x7f8,"r");
  if (__stream == (FILE *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    printf("Opening %s.\n",inputline + 0x7f8);
    _i = readnumberline(this,(char *)&stringptr,(FILE *)__stream,inputline + 0x7f8);
    if (_i == (char *)0x0) {
      fclose(__stream);
      this_local._7_1_ = true;
    }
    else {
      if (*_i == '\0') {
        this->numberoffacetconstraints = 0;
      }
      else {
        lVar3 = strtol(_i,(char **)&i,0);
        this->numberoffacetconstraints = (int)lVar3;
      }
      if (0 < this->numberoffacetconstraints) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (long)(this->numberoffacetconstraints << 1);
        uVar4 = SUB168(auVar1 * ZEXT816(8),0);
        if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
          uVar4 = 0xffffffffffffffff;
        }
        pdVar5 = (double *)operator_new__(uVar4);
        this->facetconstraintlist = pdVar5;
        local_c34 = 0;
        for (local_c38 = 0; local_c38 < this->numberoffacetconstraints; local_c38 = local_c38 + 1) {
          _i = readnumberline(this,(char *)&stringptr,(FILE *)__stream,inputline + 0x7f8);
          _i = findnextnumber(this,_i);
          if (*_i == '\0') {
            printf("Error:  facet constraint %d has no facet marker.\n",
                   (ulong)(uint)(this->firstnumber + local_c38));
            break;
          }
          dVar7 = strtod(_i,(char **)&i);
          iVar6 = local_c34 + 1;
          this->facetconstraintlist[local_c34] = dVar7;
          _i = findnextnumber(this,_i);
          if (*_i == '\0') {
            printf("Error:  facet constraint %d has no maximum area bound.\n",
                   (ulong)(uint)(this->firstnumber + local_c38));
            break;
          }
          dVar7 = strtod(_i,(char **)&i);
          local_c34 = local_c34 + 2;
          this->facetconstraintlist[iVar6] = dVar7;
        }
        if (local_c38 < this->numberoffacetconstraints) {
          fclose(__stream);
          return false;
        }
      }
      _i = readnumberline(this,(char *)&stringptr,(FILE *)__stream,inputline + 0x7f8);
      if (_i == (char *)0x0) {
        fclose(__stream);
        this_local._7_1_ = true;
      }
      else {
        if (*_i == '\0') {
          this->numberofsegmentconstraints = 0;
        }
        else {
          lVar3 = strtol(_i,(char **)&i,0);
          this->numberofsegmentconstraints = (int)lVar3;
        }
        if (0 < this->numberofsegmentconstraints) {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = (long)(this->numberofsegmentconstraints * 3);
          uVar4 = SUB168(auVar2 * ZEXT816(8),0);
          if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
            uVar4 = 0xffffffffffffffff;
          }
          pdVar5 = (double *)operator_new__(uVar4);
          this->segmentconstraintlist = pdVar5;
          local_c34 = 0;
          for (local_c38 = 0; local_c38 < this->numberofsegmentconstraints;
              local_c38 = local_c38 + 1) {
            _i = readnumberline(this,(char *)&stringptr,(FILE *)__stream,inputline + 0x7f8);
            _i = findnextnumber(this,_i);
            if (*_i == '\0') {
              printf("Error:  segment constraint %d has no frist endpoint.\n",
                     (ulong)(uint)(this->firstnumber + local_c38));
              break;
            }
            dVar7 = strtod(_i,(char **)&i);
            this->segmentconstraintlist[local_c34] = dVar7;
            _i = findnextnumber(this,_i);
            if (*_i == '\0') {
              printf("Error:  segment constraint %d has no second endpoint.\n",
                     (ulong)(uint)(this->firstnumber + local_c38));
              break;
            }
            dVar7 = strtod(_i,(char **)&i);
            iVar6 = local_c34 + 2;
            this->segmentconstraintlist[local_c34 + 1] = dVar7;
            _i = findnextnumber(this,_i);
            if (*_i == '\0') {
              printf("Error:  segment constraint %d has no maximum length bound.\n",
                     (ulong)(uint)(this->firstnumber + local_c38));
              break;
            }
            dVar7 = strtod(_i,(char **)&i);
            local_c34 = local_c34 + 3;
            this->segmentconstraintlist[iVar6] = dVar7;
          }
          if (local_c38 < this->numberofsegmentconstraints) {
            fclose(__stream);
            return false;
          }
        }
        fclose(__stream);
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool tetgenio::load_var(char* filebasename)
{
  FILE *infile;
  char varfilename[FILENAMESIZE];
  char inputline[INPUTLINESIZE];
  char *stringptr;
  int index;
  int i;

  // Variant constraints are saved in file "filename.var".
  strcpy(varfilename, filebasename);
  strcat(varfilename, ".var");
  infile = fopen(varfilename, "r");
  if (infile != (FILE *) NULL) {
    printf("Opening %s.\n", varfilename);
  } else {
    return false;
  }

  // Read the facet constraint section.
  stringptr = readnumberline(inputline, infile, varfilename);
  if (stringptr == NULL) {
    // No region list, return.
    fclose(infile);
    return true;
  }
  if (*stringptr != '\0') {
    numberoffacetconstraints = (int) strtol (stringptr, &stringptr, 0);
  } else {
    numberoffacetconstraints = 0;
  }
  if (numberoffacetconstraints > 0) {
    // Initialize 'facetconstraintlist'.
    facetconstraintlist = new REAL[numberoffacetconstraints * 2];
    index = 0;
    for (i = 0; i < numberoffacetconstraints; i++) {
      stringptr = readnumberline(inputline, infile, varfilename);
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  facet constraint %d has no facet marker.\n",
               firstnumber + i);
        break;
      } else {
        facetconstraintlist[index++] = (REAL) strtod(stringptr, &stringptr);
      }
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  facet constraint %d has no maximum area bound.\n",
               firstnumber + i);
        break;
      } else {
        facetconstraintlist[index++] = (REAL) strtod(stringptr, &stringptr);
      }
    }
    if (i < numberoffacetconstraints) {
      // This must be caused by an error.
      fclose(infile);
      return false;
    }
  }

  // Read the segment constraint section.
  stringptr = readnumberline(inputline, infile, varfilename);
  if (stringptr == NULL) {
    // No segment list, return.
    fclose(infile);
    return true;
  }
  if (*stringptr != '\0') {
    numberofsegmentconstraints = (int) strtol (stringptr, &stringptr, 0);
  } else {
    numberofsegmentconstraints = 0;
  }
  if (numberofsegmentconstraints > 0) {
    // Initialize 'segmentconstraintlist'.
    segmentconstraintlist = new REAL[numberofsegmentconstraints * 3];
    index = 0;
    for (i = 0; i < numberofsegmentconstraints; i++) {
      stringptr = readnumberline(inputline, infile, varfilename);
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  segment constraint %d has no frist endpoint.\n",
               firstnumber + i);
        break;
      } else {
        segmentconstraintlist[index++] = (REAL) strtod(stringptr, &stringptr);
      }
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  segment constraint %d has no second endpoint.\n",
               firstnumber + i);
        break;
      } else {
        segmentconstraintlist[index++] = (REAL) strtod(stringptr, &stringptr);
      }
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  segment constraint %d has no maximum length bound.\n",
               firstnumber + i);
        break;
      } else {
        segmentconstraintlist[index++] = (REAL) strtod(stringptr, &stringptr);
      }
    }
    if (i < numberofsegmentconstraints) {
      // This must be caused by an error.
      fclose(infile);
      return false;
    }
  }

  fclose(infile);
  return true;
}